

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall L13_1::Player::Player(Player *this,string *name,bool is_playing)

{
  bool is_playing_local;
  string *name_local;
  Player *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)name);
  this->_is_playing = is_playing;
  return;
}

Assistant:

Player::Player(const string &name, bool is_playing) {
        _name = name;
        _is_playing = is_playing;
    }